

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeStore
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,uint bytes,Address offset,
          uint align,Type type,Name mem)

{
  __index_type *this_00;
  Store *expr;
  bool bVar1;
  Ok local_111;
  size_t local_110;
  char *local_108;
  uintptr_t local_100;
  address64_t local_f8;
  uint local_ec;
  Err local_e8;
  Err *local_b8;
  Err *err;
  Result<wasm::Ok> _val;
  Store curr;
  uint align_local;
  uint bytes_local;
  IRBuilder *this_local;
  Type type_local;
  Address offset_local;
  
  this_00 = &_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_index;
  curr.memory.super_IString.str._M_str._0_4_ = align;
  curr.memory.super_IString.str._M_str._4_4_ = bytes;
  Store::Store((Store *)this_00);
  wasm::Name::operator=((Name *)&curr.valueType,&mem);
  curr.value = (Expression *)type.id;
  UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitStore
            ((Result<wasm::Ok> *)&err,
             (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,
             (Store *)this_00);
  local_b8 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  bVar1 = local_b8 != (Err *)0x0;
  if (bVar1) {
    wasm::Err::Err(&local_e8,local_b8);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_e8);
    wasm::Err::~Err(&local_e8);
  }
  local_ec = (uint)bVar1;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (local_ec == 0) {
    local_110 = mem.super_IString.str._M_len;
    local_108 = mem.super_IString.str._M_str;
    local_100 = type.id;
    local_f8 = offset.addr;
    expr = Builder::makeStore(&this->builder,curr.memory.super_IString.str._M_str._4_4_,offset,
                              (uint)curr.memory.super_IString.str._M_str,(Expression *)curr._40_8_,
                              curr.ptr,type,mem);
    push(this,(Expression *)expr);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_111);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeStore(
  unsigned bytes, Address offset, unsigned align, Type type, Name mem) {
  Store curr;
  curr.memory = mem;
  curr.valueType = type;
  CHECK_ERR(visitStore(&curr));
  push(
    builder.makeStore(bytes, offset, align, curr.ptr, curr.value, type, mem));
  return Ok{};
}